

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::updateTexture<QImage>
          (QOpenGL2PaintEngineExPrivate *this,GLenum textureUnit,QImage *texture,GLenum wrapMode,
          GLenum filterMode,TextureUpdateMode updateMode)

{
  long lVar1;
  GLuint GVar2;
  bool *in_RDX;
  undefined4 in_ESI;
  QOpenGL2PaintEngineExPrivate *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  GLuint textureId;
  bool newTextureCreated;
  GLenum in_stack_ffffffffffffffb8;
  GLenum in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffe0;
  QOpenGL2PaintEngineExPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  activateTextureUnit(in_RDI,in_stack_ffffffffffffffbc);
  GVar2 = bindTexture<QImage>(this_00,(QImage *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_RDX);
  if ((in_R9D != 0) || (GVar2 != in_RDI->lastTextureUsed)) {
    in_RDI->lastTextureUsed = GVar2;
    QOpenGLFunctions::glTexParameteri
              ((QOpenGLFunctions *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
    QOpenGLFunctions::glTexParameteri
              ((QOpenGLFunctions *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
    QOpenGLFunctions::glTexParameteri
              ((QOpenGLFunctions *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
    QOpenGLFunctions::glTexParameteri
              ((QOpenGLFunctions *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateTexture(GLenum textureUnit, const T &texture, GLenum wrapMode, GLenum filterMode, TextureUpdateMode updateMode)
{
    static const GLenum target = GL_TEXTURE_2D;
    bool newTextureCreated = false;

    activateTextureUnit(textureUnit);

    GLuint textureId = bindTexture(texture, &newTextureCreated);

    if (newTextureCreated)
        lastTextureUsed = GLuint(-1);

    if (updateMode == UpdateIfNeeded && textureId == lastTextureUsed)
        return;

    lastTextureUsed = textureId;

    funcs.glTexParameteri(target, GL_TEXTURE_WRAP_S, wrapMode);
    funcs.glTexParameteri(target, GL_TEXTURE_WRAP_T, wrapMode);

    funcs.glTexParameteri(target, GL_TEXTURE_MAG_FILTER, filterMode);
    funcs.glTexParameteri(target, GL_TEXTURE_MIN_FILTER, filterMode);
}